

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O2

void Llb_ManMarkInternalPivots(Aig_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  Vec_Ptr_t *vMuxes;
  Aig_Obj_t *pPivot;
  int i;
  
  vMuxes = Aig_ManMuxesCollect(p);
  Aig_ManMuxesDeref(p,vMuxes);
  Aig_ManCleanMarkB(p);
  Llb_ManLabelLiCones(p);
  Aig_ManFanoutStart(p);
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pPivot = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (((pPivot != (Aig_Obj_t *)0x0) &&
        (uVar1 = *(ulong *)&pPivot->field_0x18, 0xfffffffd < ((uint)uVar1 & 7) - 7)) &&
       ((uVar1 & 0xffffff80) != 0 && (uVar1 & 0x20) != 0)) {
      iVar2 = Llb_ManTracePaths(p,pPivot);
      if (0 < iVar2) {
        pPivot->field_0x18 = pPivot->field_0x18 | 0x10;
      }
    }
  }
  Aig_ManFanoutStop(p);
  Aig_ManCleanMarkB(p);
  Aig_ManMuxesRef(p,vMuxes);
  free(vMuxes->pArray);
  free(vMuxes);
  return;
}

Assistant:

void Llb_ManMarkInternalPivots( Aig_Man_t * p )
{
    Vec_Ptr_t * vMuxes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;

    // remove refs due to MUXes
    vMuxes = Aig_ManMuxesCollect( p );
    Aig_ManMuxesDeref( p, vMuxes );

    // mark nodes feeding into LIs
    Aig_ManCleanMarkB( p );
    Llb_ManLabelLiCones( p );

    // mark internal nodes
    Aig_ManFanoutStart( p );
    Aig_ManForEachNode( p, pObj, i )
        if ( pObj->fMarkB && pObj->nRefs > 1 )
        {
            if ( Llb_ManTracePaths(p, pObj) > 0 )
                pObj->fMarkA = 1;
            Counter++;
        }
    Aig_ManFanoutStop( p );
//    printf( "TracePath tried = %d.\n", Counter );

    // mark nodes feeding into LIs
    Aig_ManCleanMarkB( p );

    // add refs due to MUXes
    Aig_ManMuxesRef( p, vMuxes );
    Vec_PtrFree( vMuxes );
}